

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O1

void R_FillSubClampColumn(void)

{
  DWORD *pDVar1;
  int iVar2;
  byte *pbVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  
  pDVar1 = dc_destblend;
  if (0 < dc_count) {
    uVar4 = dc_srccolor | 0x40100400;
    lVar5 = (long)dc_pitch;
    pbVar3 = dc_dest;
    iVar2 = dc_count;
    do {
      uVar7 = uVar4 - pDVar1[*pbVar3];
      uVar6 = uVar7 & 0x40100400;
      uVar6 = uVar6 - (uVar6 >> 5) & uVar7 | 0x1f07c1f;
      *pbVar3 = RGB32k.All[uVar6 >> 0xf & uVar6];
      pbVar3 = pbVar3 + lVar5;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  return;
}

Assistant:

void R_FillSubClampColumn (void)
{
	int count;
	BYTE *dest;

	count = dc_count;
	if (count <= 0)
		return;

	dest = dc_dest;
	DWORD *bg2rgb;
	DWORD fg;

	bg2rgb = dc_destblend;
	fg = dc_srccolor | 0x40100400;
	int pitch = dc_pitch;

	do
	{
		DWORD a = fg - bg2rgb[*dest];
		DWORD b = a;

		b &= 0x40100400;
		b = b - (b >> 5);
		a &= b;
		a |= 0x01f07c1f;
		*dest = RGB32k.All[a & (a>>15)];
		dest += pitch; 
	} while (--count);

}